

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O1

UINT16 calculateChecksum16(UINT16 *buffer,UINT32 bufferSize)

{
  short sVar1;
  ulong uVar2;
  
  if (buffer != (UINT16 *)0x0) {
    if (bufferSize < 2) {
      sVar1 = 0;
    }
    else {
      uVar2 = 0;
      sVar1 = 0;
      do {
        sVar1 = sVar1 + buffer[uVar2];
        uVar2 = uVar2 + 1;
      } while (bufferSize >> 1 != uVar2);
    }
    return -sVar1;
  }
  return 0;
}

Assistant:

UINT16 calculateChecksum16(const UINT16* buffer, UINT32 bufferSize)
{
    if (!buffer)
        return 0;
    
    UINT16 counter = 0;
    UINT32 index = 0;
    
    bufferSize /= sizeof(UINT16);
    
    for (; index < bufferSize; index++) {
        counter = (UINT16)(counter + buffer[index]);
    }
    
    return (UINT16)(0x10000 - counter);
}